

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O3

void pleased(aligntyp g_align)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  obj *poVar12;
  obj *poVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  int n;
  uint uVar17;
  int n_1;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  char repair_buf [256];
  char local_138 [264];
  
  iVar5 = in_trouble();
  pcVar9 = align_gname(g_align);
  if (u.ualign.record < 0xe) {
    if (u.ualign.record < 4) {
      if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
        pcVar16 = "satisfied";
      }
      else {
        if (u.umonnum != u.umonster) {
          bVar4 = dmgtype(youmonst.data,0x24);
          bVar20 = bVar4 == '\0';
          pcVar10 = "full";
          pcVar16 = "satisfied";
          goto LAB_00227690;
        }
        pcVar16 = "full";
      }
    }
    else if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
      pcVar16 = "pleased";
    }
    else if (u.umonnum == u.umonster) {
      pcVar16 = "ticklish";
    }
    else {
      bVar4 = dmgtype(youmonst.data,0x24);
      bVar20 = bVar4 == '\0';
      pcVar10 = "ticklish";
      pcVar16 = "pleased";
LAB_00227690:
      if (bVar20) {
        pcVar16 = pcVar10;
      }
    }
  }
  else {
    pcVar16 = "well-pleased";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum != u.umonster) {
        bVar4 = dmgtype(youmonst.data,0x24);
        bVar20 = bVar4 == '\0';
        pcVar10 = "pleased as punch";
        pcVar16 = "well-pleased";
        goto LAB_00227690;
      }
      pcVar16 = "pleased as punch";
    }
  }
  pline("You feel that %s is %s.",pcVar9,pcVar16);
  if ((level->locations[u.ux][u.uy].typ == '!') && (p_aligntyp != u.ualign.type)) {
    adjalign(-1);
    return;
  }
  if (iVar5 < 1 && u.ualign.record < 2) {
    adjalign(1);
  }
  if ((iVar5 == 0) && (0xd < u.ualign.record)) {
    if (p_trouble != 0) goto switchD_00227906_caseD_0;
    goto LAB_002278c4;
  }
  iVar6 = (int)u.uluck;
  iVar18 = (int)u.moreluck;
  iVar14 = 2;
  if (level->locations[u.ux][u.uy].typ == '!') {
    iVar14 = ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 7 & 1) != 0) + 3;
  }
  uVar7 = mt_random();
  uVar17 = SUB164(ZEXT416(uVar7) % SEXT816((long)(iVar18 + iVar6 + iVar14)),0) + 1;
  uVar7 = 3;
  if (uVar17 < 3) {
    uVar7 = uVar17;
  }
  if (level->locations[u.ux][u.uy].typ == '!') {
    uVar7 = uVar17;
  }
  if ((u.ualign.record < 4) && (uVar7 = 1, u.ualign.record < 1)) {
    uVar17 = mt_random();
    uVar17 = uVar17 & 1;
    lVar15 = (long)u.uluck;
    lVar11 = (long)u.moreluck;
    uVar7 = uVar17;
    if (((int)(lVar11 + lVar15) != 0) &&
       (uVar8 = mt_random(), SUB168(ZEXT416(uVar8) % SEXT816(0x32 - (lVar11 + lVar15)),0) != 0)) {
      uVar8 = (int)u.moreluck + (int)u.uluck;
      if (-6 < (int)uVar8) {
        sVar3 = (short)(uVar8 * 0x5556 >> 0x10);
        uVar8 = (uint)(short)(sVar3 - (sVar3 >> 0xf));
      }
      uVar7 = 0;
      if ((int)uVar8 <= (int)uVar17) {
        uVar7 = (uint)(uVar17 != uVar8);
      }
    }
    uVar7 = uVar7 ^ 1;
  }
  uVar17 = 5;
  if (uVar7 < 5) {
    uVar17 = uVar7;
  }
  switch(uVar17) {
  case 1:
    if (0 < iVar5) {
      fix_worst_trouble(iVar5);
    }
    break;
  case 2:
    while (iVar5 = in_trouble(), 0 < iVar5) {
LAB_00228189:
      fix_worst_trouble(iVar5);
    }
    break;
  case 3:
    goto LAB_00228189;
  case 4:
    bVar20 = true;
    goto LAB_002278a9;
  case 5:
    bVar20 = false;
LAB_002278a9:
    do {
      fix_worst_trouble(iVar5);
      iVar5 = in_trouble();
    } while (iVar5 != 0);
    if (bVar20) break;
LAB_002278c4:
    iVar6 = (int)u.uluck;
    iVar14 = (int)u.moreluck;
    uVar7 = mt_random();
    iVar5 = u.ulevel;
    switch(SUB168(ZEXT416(uVar7) % SEXT816((long)(short)(iVar6 + iVar14 + 6U >> 1)),0)) {
    case 0:
      break;
    case 1:
      if ((uwep == (obj *)0x0) ||
         (((iVar5 = welded(uwep), iVar5 == 0 && (uwep->oclass != '\x02')) &&
          ((uwep->oclass != '\x06' || (objects[uwep->otyp].oc_subtyp == '\0')))))) break;
      local_138[0] = '\0';
      uVar7 = *(uint *)&uwep->field_0x4a;
      if ((uVar7 & 0xf00) != 0) {
        pcVar9 = otense(uwep,"are");
        sprintf(local_138," and %s now as good as new",pcVar9);
        uVar7 = *(uint *)&uwep->field_0x4a;
      }
      if ((uVar7 & 1) == 0) {
        if ((uVar7 & 2) == 0) {
          bless(uwep);
          poVar12 = uwep;
          *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a | 0x40;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227b75;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00227b70;
LAB_0022808d:
            pcVar9 = aobjnam(poVar12,"softly glow");
            pcVar16 = hcolor("light blue");
            pcVar16 = an(pcVar16);
            pcVar10 = "Your %s with %s aura%s.";
            goto LAB_002280b7;
          }
LAB_00227b70:
          if (ublindf != (obj *)0x0) {
LAB_00227b75:
            if (ublindf->oartifact == '\x1d') goto LAB_0022808d;
          }
          pcVar9 = align_gname(u.ualign.type);
          pcVar16 = xname(uwep);
          pcVar10 = "You feel the blessing of %s over your %s.";
LAB_00227ee0:
          pline(pcVar10,pcVar9,pcVar16);
          goto LAB_002280c7;
        }
      }
      else {
        uncurse(uwep);
        poVar12 = uwep;
        *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a | 0x40;
        if (u.uprops[0x1e].intrinsic != 0) {
LAB_00227eb2:
          if (ublindf != (obj *)0x0) {
LAB_00227eb7:
            if (ublindf->oartifact == '\x1d') goto LAB_00227ffe;
          }
          pcVar9 = align_gname(u.ualign.type);
          pcVar16 = xname(uwep);
          pcVar10 = "You feel the power of %s over your %s.";
          goto LAB_00227ee0;
        }
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227eb7;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00227eb2;
LAB_00227ffe:
        pcVar9 = aobjnam(poVar12,"softly glow");
        pcVar16 = hcolor("amber");
        pcVar10 = "Your %s %s%s.";
LAB_002280b7:
        pline(pcVar10,pcVar9,pcVar16,local_138);
LAB_002280c7:
        local_138[0] = '\0';
      }
      poVar12 = uwep;
      if (((*(uint *)&uwep->field_0x4a & 0xf00) != 0) &&
         (*(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xfffff0ff, local_138[0] != '\0'
         )) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00228103;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002280fe;
          pcVar9 = "look";
        }
        else {
LAB_002280fe:
          if (ublindf == (obj *)0x0) {
            pcVar9 = "feel";
          }
          else {
LAB_00228103:
            pcVar9 = "feel";
            if (ublindf->oartifact == '\x1d') {
              pcVar9 = "look";
            }
          }
        }
        pcVar9 = aobjnam(poVar12,pcVar9);
        pline("Your %s as good as new!",pcVar9);
      }
      goto LAB_0022815f;
    case 2:
      goto switchD_00227906_caseD_2;
    case 3:
      if (((ushort)u.uevent._0_2_ >> 8 & 1) == 0) {
        if (((ushort)u.uevent._0_2_ >> 6 & 3) == 1) {
          You_hear("a divine music...");
          pline("It sounds like:  \"%s\".",tune);
        }
        else {
          if (((ushort)u.uevent._0_2_ >> 6 & 3) != 0) goto switchD_00227906_caseD_2;
          godvoice(g_align,(char *)0x0);
          pcVar9 = "creature";
          if ((youmonst.data)->mlet == '5') {
            pcVar9 = "mortal";
          }
          verbalize("Hark, %s!",pcVar9);
          verbalize("To enter the castle, thou must play the right tune!");
        }
        u.uevent._0_2_ = u.uevent._0_2_ & 0xff3f | u.uevent._0_2_ + 0x40 & 0xc0;
        break;
      }
switchD_00227906_caseD_2:
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227ad6;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00227acd;
LAB_00227c4d:
        pcVar9 = hcolor("golden");
        pcVar9 = an(pcVar9);
        pline("You are surrounded by %s glow.",pcVar9);
      }
      else {
LAB_00227acd:
        if (ublindf != (obj *)0x0) {
LAB_00227ad6:
          if (ublindf->oartifact == '\x1d') goto LAB_00227c4d;
        }
      }
      if (u.ulevel < u.ulevelmax) {
        u.ulevelmax = u.ulevelmax + -1;
        pluslvl('\0');
LAB_00227cde:
        if (u.umonnum != u.umonster) {
          u.mh = u.mhmax;
        }
      }
      else {
        u.uhpmax = u.uhpmax + 5;
        if (u.umonnum != u.umonster) {
          u.mhmax = u.mhmax + 5;
          goto LAB_00227cde;
        }
      }
      u.acurr.a[0] = u.amax.a[0];
      u.uhp = u.uhpmax;
      if (u.uhunger < 900) {
        init_uhunger();
      }
      if (u.uluck < '\0') {
        u.uluck = '\0';
      }
      make_blinded(0,'\x01');
      iflags.botl = '\x01';
      break;
    case 4:
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227a25;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00227a20;
LAB_00227d68:
        pcVar9 = hcolor("light blue");
        pcVar9 = an(pcVar9);
        pcVar16 = "You are surrounded by %s aura.";
      }
      else {
LAB_00227a20:
        if (ublindf != (obj *)0x0) {
LAB_00227a25:
          if (ublindf->oartifact == '\x1d') goto LAB_00227d68;
        }
        pcVar9 = align_gname(u.ualign.type);
        pcVar16 = "You feel the power of %s.";
      }
      pline(pcVar16,pcVar9);
      if (invent == (obj *)0x0) break;
      iVar5 = 0;
      poVar12 = invent;
      do {
        if ((poVar12->field_0x4a & 1) != 0) {
          uncurse(poVar12);
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00227dc9;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00227dc4;
LAB_00227def:
            pcVar9 = aobjnam(poVar12,"softly glow");
            pcVar16 = hcolor("amber");
            pline("Your %s %s.",pcVar9,pcVar16);
            poVar12->field_0x4a = poVar12->field_0x4a | 0x40;
            iVar5 = iVar5 + 1;
          }
          else {
LAB_00227dc4:
            if (ublindf != (obj *)0x0) {
LAB_00227dc9:
              if (ublindf->oartifact == '\x1d') goto LAB_00227def;
            }
          }
        }
        poVar12 = poVar12->nobj;
      } while (poVar12 != (obj *)0x0);
      if (iVar5 == 0) break;
LAB_0022815f:
      update_inventory();
      break;
    case 5:
      godvoice(u.ualign.type,"Thou hast pleased me with thy progress,");
      if ((u.uprops[0x19].intrinsic & 0x7000000) == 0) {
        u.uprops[0x19].intrinsic = u.uprops[0x19].intrinsic | 0x4000000;
        pline("\"and thus I grant thee the gift of %s!\"","Telepathy");
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
            if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_00228054;
            goto LAB_00227e75;
          }
LAB_00227e7a:
          if (ublindf->oartifact == '\x1d') goto LAB_00228054;
        }
        else {
LAB_00227e75:
          if (ublindf != (obj *)0x0) goto LAB_00227e7a;
        }
        see_monsters();
      }
      else {
        if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
          u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
          pcVar9 = "Speed";
        }
        else if ((u.uprops[0x13].intrinsic & 0x7000000) == 0) {
          u.uprops[0x13].intrinsic = u.uprops[0x13].intrinsic | 0x4000000;
          pcVar9 = "Stealth";
        }
        else {
          if ((u.uprops[0x16].intrinsic & 0x7000000) == 0) {
            u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic | 0x4000000;
            if (u.ublessed == 0) {
              uVar7 = mt_random();
              u.ublessed = uVar7 % 3 + 2;
            }
          }
          else {
            u.ublessed = u.ublessed + 1;
          }
          pcVar9 = "my protection";
        }
        pline("\"and thus I grant thee the gift of %s!\"",pcVar9);
      }
LAB_00228054:
      verbalize("Use it wisely in my name!");
      break;
    case 6:
      goto switchD_00227906_caseD_6;
    case 7:
    case 8:
    case 9:
      if (((flags.elbereth_enabled != '\0') && (0x13 < u.ualign.record)) &&
         (((uint)u.uevent & 0x1800) == 0)) {
        gcrownu();
        break;
      }
switchD_00227906_caseD_6:
      at_your_feet("An object");
      poVar12 = mkobj(level,'\n','\x01');
      if (0 < iVar5) {
        uVar7 = (uint)(ushort)poVar12->otyp;
        do {
          if ((uVar7 & 0xffff) == 0x1bc) {
            if (((objects[0x1bc].field_0x10 & 1) == 0) ||
               (poVar13 = carrying(0xf7), poVar13 != (obj *)0x0)) break;
          }
          else {
            lVar11 = 0;
            do {
              if (spl_book[lVar11].sp_id == (short)uVar7) goto LAB_002279c8;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x2b);
            iVar6 = spell_skilltype((int)(short)uVar7);
            if (u.weapon_skills[iVar6].skill != '\0') break;
          }
LAB_002279c8:
          uVar7 = rnd_class(bases[10],0x1bc);
          poVar12->otyp = (short)uVar7;
          bVar20 = 1 < iVar5;
          iVar5 = iVar5 + -1;
        } while (bVar20);
      }
      bless(poVar12);
      place_object(poVar12,level,(int)u.ux,(int)u.uy);
      break;
    default:
      warning("Confused deity!");
    }
  }
switchD_00227906_caseD_0:
  uVar7 = mt_random();
  uVar17 = 1;
  do {
    uVar8 = mt_random();
    if (1 < uVar8 % 6) goto LAB_002281ef;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 10);
  uVar17 = 10;
LAB_002281ef:
  uVar19 = (ulong)uVar17 * (ulong)(uVar7 % 1000 + 1000);
  uVar7 = mt_random();
  if ((uVar7 & 1) == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar19;
    u.ublesscnt = SUB164((ZEXT816(0) << 0x40 | ZEXT816(350000)) / auVar1,0);
  }
  else {
    u.ublesscnt = (int)((uVar19 * 0x15e) / 1000);
  }
  iVar5 = (uint)(((uint)u.uevent & 0x1800) != 0 && flags.elbereth_enabled != '\0') +
          (uint)(((ushort)u.uevent._0_2_ >> 0xd & 1) != 0);
  if (iVar5 != 0) {
    uVar7 = mt_random();
    uVar17 = 1;
    do {
      uVar8 = mt_random();
      if (1 < uVar8 % 6) goto LAB_002282bc;
      uVar17 = uVar17 + 1;
    } while (uVar17 != 10);
    uVar17 = 10;
LAB_002282bc:
    uVar19 = (ulong)uVar17 * (ulong)(uVar7 % 1000 + 1000);
    uVar7 = mt_random();
    if ((uVar7 & 1) == 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar19;
      uVar19 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar2,0);
    }
    u.ublesscnt = u.ublesscnt + iVar5 * (int)uVar19;
  }
  return;
}

Assistant:

static void pleased(aligntyp g_align)
{
	/* don't use p_trouble, worst trouble may get fixed while praying */
	int trouble = in_trouble();	/* what's your worst difficulty? */
	int pat_on_head = 0, kick_on_butt;

	pline("You feel that %s is %s.", align_gname(g_align),
	    u.ualign.record >= DEVOUT ?
	    Hallucination ? "pleased as punch" : "well-pleased" :
	    u.ualign.record >= STRIDENT ?
	    Hallucination ? "ticklish" : "pleased" :
	    Hallucination ? "full" : "satisfied");

	/* not your deity */
	if (on_altar() && p_aligntyp != u.ualign.type) {
		adjalign(-1);
		return;
	} else if (u.ualign.record < 2 && trouble <= 0) adjalign(1);

	/* depending on your luck & align level, the god you prayed to will:
	   - fix your worst problem if it's major.
	   - fix all your major problems.
	   - fix your worst problem if it's minor.
	   - fix all of your problems.
	   - do you a gratuitous favor.

	   if you make it to the the last category, you roll randomly again
	   to see what they do for you.

	   If your luck is at least 0, then you are guaranteed rescued
	   from your worst major problem. */

	if (!trouble && u.ualign.record >= DEVOUT) {
	    /* if hero was in trouble, but got better, no special favor */
	    if (p_trouble == 0) pat_on_head = 1;
	} else {
	    int action = rn1(Luck + (on_altar() ? 3 + on_shrine() : 2), 1);

	    if (!on_altar()) action = min(action, 3);
	    if (u.ualign.record < STRIDENT)
		action = (u.ualign.record > 0 || !rnl(2)) ? 1 : 0;

	    switch(min(action,5)) {
	    case 5: pat_on_head = 1;
	    case 4: do fix_worst_trouble(trouble);
		    while ((trouble = in_trouble()) != 0);
		    break;

	    case 3: fix_worst_trouble(trouble);
	    case 2: while ((trouble = in_trouble()) > 0)
		    fix_worst_trouble(trouble);
		    break;

	    case 1: if (trouble > 0) fix_worst_trouble(trouble);
	    case 0: break; /* your god blows you off, too bad */
	    }
	}

    /* note: can't get pat_on_head unless all troubles have just been
       fixed or there were no troubles to begin with; hallucination
       won't be in effect so special handling for it is superfluous */
    if (pat_on_head)
	switch(rn2((Luck + 6)>>1)) {
	case 0:	break;
	case 1:
	    if (uwep && (welded(uwep) || uwep->oclass == WEAPON_CLASS ||
			 is_weptool(uwep))) {
		char repair_buf[BUFSZ];

		*repair_buf = '\0';
		if (uwep->oeroded || uwep->oeroded2)
		    sprintf(repair_buf, " and %s now as good as new",
			    otense(uwep, "are"));

		if (uwep->cursed) {
		    uncurse(uwep);
		    uwep->bknown = TRUE;
		    if (!Blind)
			pline("Your %s %s%s.", aobjnam(uwep, "softly glow"),
			     hcolor("amber"), repair_buf);
		    else pline("You feel the power of %s over your %s.",
			u_gname(), xname(uwep));
		    *repair_buf = '\0';
		} else if (!uwep->blessed) {
		    bless(uwep);
		    uwep->bknown = TRUE;
		    if (!Blind)
			pline("Your %s with %s aura%s.",
			     aobjnam(uwep, "softly glow"),
			     an(hcolor("light blue")), repair_buf);
		    else pline("You feel the blessing of %s over your %s.",
			u_gname(), xname(uwep));
		    *repair_buf = '\0';
		}

		/* fix any rust/burn/rot damage, but don't protect
		   against future damage */
		if (uwep->oeroded || uwep->oeroded2) {
		    uwep->oeroded = uwep->oeroded2 = 0;
		    /* only give this message if we didn't just bless
		       or uncurse (which has already given a message) */
		    if (*repair_buf)
			pline("Your %s as good as new!",
			     aobjnam(uwep, Blind ? "feel" : "look"));
		}
		update_inventory();
	    }
	    break;
	case 3:
	    /* takes 2 hints to get the music to enter the stronghold */
	    if (!u.uevent.uopened_dbridge) {
		if (u.uevent.uheard_tune < 1) {
		    godvoice(g_align,NULL);
		    verbalize("Hark, %s!",
			  youmonst.data->mlet == S_HUMAN ? "mortal" : "creature");
		    verbalize(
			"To enter the castle, thou must play the right tune!");
		    u.uevent.uheard_tune++;
		    break;
		} else if (u.uevent.uheard_tune < 2) {
		    You_hear("a divine music...");
		    pline("It sounds like:  \"%s\".", tune);
		    u.uevent.uheard_tune++;
		    break;
		}
	    }
	    /* Otherwise, falls into next case */
	case 2:
	    if (!Blind)
		pline("You are surrounded by %s glow.", an(hcolor("golden")));
	    /* if any levels have been lost (and not yet regained),
	       treat this effect like blessed full healing */
	    if (u.ulevel < u.ulevelmax) {
		u.ulevelmax -= 1;	/* see potion.c */
		pluslvl(FALSE);
	    } else {
		u.uhpmax += 5;
		if (Upolyd) u.mhmax += 5;
	    }
	    u.uhp = u.uhpmax;
	    if (Upolyd) u.mh = u.mhmax;
	    ABASE(A_STR) = AMAX(A_STR);
	    if (u.uhunger < 900) init_uhunger();
	    if (u.uluck < 0) u.uluck = 0;
	    make_blinded(0L,TRUE);
	    iflags.botl = 1;
	    break;
	case 4: {
	    struct obj *otmp;
	    int any = 0;

	    if (Blind)
		pline("You feel the power of %s.", u_gname());
	    else pline("You are surrounded by %s aura.",
		     an(hcolor("light blue")));
	    for (otmp=invent; otmp; otmp=otmp->nobj) {
		if (otmp->cursed) {
		    uncurse(otmp);
		    if (!Blind) {
			pline("Your %s %s.", aobjnam(otmp, "softly glow"),
			     hcolor("amber"));
			otmp->bknown = TRUE;
			++any;
		    }
		}
	    }
	    if (any) update_inventory();
	    break;
	}
	case 5: {
	    const char *msg="\"and thus I grant thee the gift of %s!\"";
	    godvoice(u.ualign.type, "Thou hast pleased me with thy progress,");
	    if (!(HTelepat & INTRINSIC))  {
		HTelepat |= FROMOUTSIDE;
		pline(msg, "Telepathy");
		if (Blind) see_monsters();
	    } else if (!(HFast & INTRINSIC))  {
		HFast |= FROMOUTSIDE;
		pline(msg, "Speed");
	    } else if (!(HStealth & INTRINSIC))  {
		HStealth |= FROMOUTSIDE;
		pline(msg, "Stealth");
	    } else {
		if (!(HProtection & INTRINSIC))  {
		    HProtection |= FROMOUTSIDE;
		    if (!u.ublessed)  u.ublessed = rn1(3, 2);
		} else u.ublessed++;
		pline(msg, "my protection");
	    }
	    verbalize("Use it wisely in my name!");
	    break;
	}
	case 7:
	case 8:
	case 9:		/* KMH -- can occur during full moons */
	    if (flags.elbereth_enabled)
		if (u.ualign.record >= PIOUS && !u.uevent.uhand_of_elbereth) {
		    gcrownu();
		    break;
		} /* else FALLTHRU */
	case 6:	{
	    struct obj *otmp;
	    int sp_no, trycnt = u.ulevel + 1;

	    at_your_feet("An object");
	    /* not yet known spells given preference over already known ones */
	    /* Also, try to grant a spell for which there is a skill slot */
	    otmp = mkobj(level, SPBOOK_CLASS, TRUE);
	    while (--trycnt > 0) {
		if (otmp->otyp != SPE_BLANK_PAPER) {
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == otmp->otyp) break;
		    if (sp_no == MAXSPELL &&
			!P_RESTRICTED(spell_skilltype(otmp->otyp)))
			break;	/* usable, but not yet known */
		} else {
		    if (!objects[SPE_BLANK_PAPER].oc_name_known ||
			    carrying(MAGIC_MARKER)) break;
		}
		otmp->otyp = rnd_class(bases[SPBOOK_CLASS], SPE_BLANK_PAPER);
	    }
	    bless(otmp);
	    place_object(otmp, level, u.ux, u.uy);
	    break;
	}
	default:	warning("Confused deity!");
	    break;
	}

	u.ublesscnt = rnz(350);
	kick_on_butt = u.uevent.udemigod ? 1 : 0;

	if (flags.elbereth_enabled && u.uevent.uhand_of_elbereth)
	    kick_on_butt++;

	if (kick_on_butt)
	    u.ublesscnt += kick_on_butt * rnz(1000);

	return;
}